

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O0

void mtbdd_fprint_leaf(FILE *out,MTBDD leaf)

{
  char **__s;
  char *ptr;
  char buf [64];
  MTBDD leaf_local;
  FILE *out_local;
  
  buf._56_8_ = leaf;
  __s = (char **)mtbdd_leaf_to_str(leaf,(char *)&ptr,0x40);
  if ((__s != (char **)0x0) && (fputs((char *)__s,(FILE *)out), __s != &ptr)) {
    free(__s);
  }
  return;
}

Assistant:

void
mtbdd_fprint_leaf(FILE *out, MTBDD leaf)
{
    char buf[64];
    char *ptr = mtbdd_leaf_to_str(leaf, buf, 64);
    if (ptr != NULL) {
        fputs(ptr, out);
        if (ptr != buf) free(ptr);
    }
}